

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

bounded_buffer * peparse::readFileToFileBuffer(char *filePath)

{
  int __fd;
  int iVar1;
  bounded_buffer *pbVar2;
  buffer_detail *pbVar3;
  long *plVar4;
  uint8_t *puVar5;
  __nlink_t *p_Var6;
  size_type *psVar7;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  stat s;
  string local_f0;
  string local_d0;
  stat local_b0;
  
  __fd = open(filePath,0);
  if (__fd == -1) {
    err = 7;
    std::__cxx11::string::_M_replace(0x11d2a8,0,DAT_0011d2b0,0x1167d7);
    to_string<unsigned_int>(&local_f0,0xb8,f);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x116010);
    local_b0.st_dev = (__dev_t)&local_b0.st_nlink;
    p_Var6 = (__nlink_t *)(plVar4 + 2);
    if ((__nlink_t *)*plVar4 == p_Var6) {
      local_b0.st_nlink = *p_Var6;
      local_b0._24_8_ = plVar4[3];
    }
    else {
      local_b0.st_nlink = *p_Var6;
      local_b0.st_dev = (__dev_t)*plVar4;
    }
    local_b0.st_ino = plVar4[1];
    *plVar4 = (long)p_Var6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_b0.st_dev);
  }
  else {
    pbVar2 = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pbVar2 == (bounded_buffer *)0x0) {
      pbVar2 = (bounded_buffer *)0x0;
    }
    else {
      pbVar2->buf = (uint8_t *)0x0;
      pbVar2->bufLen = 0;
      pbVar2->copy = false;
      pbVar2->swapBytes = false;
      *(undefined2 *)&pbVar2->field_0xe = 0;
      pbVar2->detail = (buffer_detail *)0x0;
    }
    if (pbVar2 == (bounded_buffer *)0x0) {
      err = 1;
      std::__cxx11::string::_M_replace(0x11d2a8,0,DAT_0011d2b0,0x1167d7);
      to_string<unsigned_int>(&local_f0,0xc0,f_00);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x116010);
      local_b0.st_dev = (__dev_t)&local_b0.st_nlink;
      p_Var6 = (__nlink_t *)(plVar4 + 2);
      if ((__nlink_t *)*plVar4 == p_Var6) {
        local_b0.st_nlink = *p_Var6;
        local_b0._24_8_ = plVar4[3];
      }
      else {
        local_b0.st_nlink = *p_Var6;
        local_b0.st_dev = (__dev_t)*plVar4;
      }
      local_b0.st_ino = plVar4[1];
      *plVar4 = (long)p_Var6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_b0.st_dev);
    }
    else {
      pbVar2->buf = (uint8_t *)0x0;
      pbVar2->bufLen = 0;
      pbVar2->copy = false;
      pbVar2->swapBytes = false;
      *(undefined2 *)&pbVar2->field_0xe = 0;
      pbVar2->detail = (buffer_detail *)0x0;
      pbVar3 = (buffer_detail *)operator_new(4,(nothrow_t *)&std::nothrow);
      if (pbVar3 == (buffer_detail *)0x0) {
        pbVar3 = (buffer_detail *)0x0;
      }
      else {
        pbVar3->fd = 0;
      }
      if (pbVar3 != (buffer_detail *)0x0) {
        pbVar3->fd = 0;
        pbVar2->detail = pbVar3;
        pbVar3->fd = __fd;
        memset(&local_b0,0,0x90);
        iVar1 = fstat(__fd,&local_b0);
        if (iVar1 == 0) {
          puVar5 = (uint8_t *)mmap((void *)0x0,local_b0.st_size,1,1,__fd,0);
          if (puVar5 != (uint8_t *)0xffffffffffffffff) {
            pbVar2->buf = puVar5;
            pbVar2->bufLen = (uint32_t)local_b0.st_size;
            pbVar2->copy = false;
            pbVar2->swapBytes = false;
            return pbVar2;
          }
          close(__fd);
          operator_delete(pbVar3,4);
          operator_delete(pbVar2,0x18);
          err = 1;
          std::__cxx11::string::_M_replace(0x11d2a8,0,DAT_0011d2b0,0x1167d7);
          to_string<unsigned_int>(&local_d0,0xff,f_03);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x116010);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)&err_loc_abi_cxx11_,(ulong)local_f0._M_dataplus._M_p);
        }
        else {
          close(__fd);
          operator_delete(pbVar3,4);
          operator_delete(pbVar2,0x18);
          err = 8;
          std::__cxx11::string::_M_replace(0x11d2a8,0,DAT_0011d2b0,0x1167d7);
          to_string<unsigned_int>(&local_d0,0xf0,f_01);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x116010);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)&err_loc_abi_cxx11_,(ulong)local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
          return (bounded_buffer *)0x0;
        }
        goto LAB_001158f9;
      }
      operator_delete(pbVar2,0x18);
      err = 1;
      std::__cxx11::string::_M_replace(0x11d2a8,0,DAT_0011d2b0,0x1167d7);
      to_string<unsigned_int>(&local_f0,0xc9,f_02);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x116010);
      local_b0.st_dev = (__dev_t)&local_b0.st_nlink;
      p_Var6 = (__nlink_t *)(plVar4 + 2);
      if ((__nlink_t *)*plVar4 == p_Var6) {
        local_b0.st_nlink = *p_Var6;
        local_b0._24_8_ = plVar4[3];
      }
      else {
        local_b0.st_nlink = *p_Var6;
        local_b0.st_dev = (__dev_t)*plVar4;
      }
      local_b0.st_ino = plVar4[1];
      *plVar4 = (long)p_Var6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_b0.st_dev);
    }
  }
  if ((__nlink_t *)local_b0.st_dev != &local_b0.st_nlink) {
    operator_delete((void *)local_b0.st_dev,local_b0.st_nlink + 1);
  }
  local_d0.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
  local_d0._M_dataplus._M_p = local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return (bounded_buffer *)0x0;
  }
LAB_001158f9:
  operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  return (bounded_buffer *)0x0;
}

Assistant:

bounded_buffer *readFileToFileBuffer(const char *filePath) {
#ifdef WIN32
  HANDLE h = CreateFileA(filePath,
                         GENERIC_READ,
                         FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE,
                         nullptr,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         nullptr);
  if (h == INVALID_HANDLE_VALUE) {
    return nullptr;
  }

  DWORD fileSize = GetFileSize(h, nullptr);

  if (fileSize == INVALID_FILE_SIZE) {
    CloseHandle(h);
    return nullptr;
  }

#else
  // only where we have mmap / open / etc
  int fd = open(filePath, O_RDONLY);

  if (fd == -1) {
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }
#endif

  // make a buffer object
  bounded_buffer *p = new (std::nothrow) bounded_buffer();
  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  memset(p, 0, sizeof(bounded_buffer));
  buffer_detail *d = new (std::nothrow) buffer_detail();

  if (d == nullptr) {
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }
  memset(d, 0, sizeof(buffer_detail));
  p->detail = d;

// only where we have mmap / open / etc
#ifdef WIN32
  p->detail->file = h;

  HANDLE hMap = CreateFileMapping(h, nullptr, PAGE_READONLY, 0, 0, nullptr);

  if (hMap == nullptr) {
    CloseHandle(h);
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->detail->sec = hMap;

  LPVOID ptr = MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);

  if (ptr == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = (::uint8_t *) ptr;
  p->bufLen = fileSize;
#else
  p->detail->fd = fd;

  struct stat s;
  memset(&s, 0, sizeof(struct stat));

  if (fstat(fd, &s) != 0) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_STAT);
    return nullptr;
  }

  void *maddr = mmap(nullptr,
                     static_cast<std::size_t>(s.st_size),
                     PROT_READ,
                     MAP_SHARED,
                     fd,
                     0);

  if (maddr == MAP_FAILED) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = reinterpret_cast<std::uint8_t *>(maddr);
  p->bufLen = static_cast<std::uint32_t>(s.st_size);
#endif
  p->copy = false;
  p->swapBytes = false;

  return p;
}